

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void storeRange(uint32_t start,uint32_t end,UStringPrepType type,UErrorCode *status)

{
  UBool UVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint32_t savedTrieWord;
  uint16_t trieWord;
  UErrorCode *status_local;
  UStringPrepType type_local;
  uint32_t end_local;
  uint32_t start_local;
  
  if (0xffff < (int)(type + 0xfff0)) {
    fprintf(_stderr,"trieWord cannot contain value greater than 0xFFFF.\n");
    exit(0xc);
  }
  uVar2 = (short)type - 0x10;
  if (start == end) {
    uVar3 = utrie_get32_63(sprepTrie,start,(UBool *)0x0);
    if (uVar3 != 0) {
      if ((uVar3 < 0xfff0) && (type == USPREP_PROHIBITED)) {
        if (0xffef < (ushort)(uVar3 + 1)) {
          fprintf(_stderr,"trieWord cannot contain value greater than threshold 0x%04X.\n",0xfff0);
          exit(0xc);
        }
        UVar1 = utrie_set32_63(sprepTrie,start,uVar3 + 1 & 0xffff);
        if (UVar1 != '\0') {
          return;
        }
        fprintf(_stderr,"Could not set the value for code point.\n");
        exit(1);
      }
      if (uVar3 != uVar2) {
        fprintf(_stderr,"Value for codepoint \\U%08X already set!.\n",(ulong)start);
        exit(1);
      }
    }
    UVar1 = utrie_set32_63(sprepTrie,start,(uint)uVar2);
    if (UVar1 == '\0') {
      fprintf(_stderr,"Could not set the value for code point \\U%08X.\n",(ulong)start);
      exit(1);
    }
  }
  else {
    UVar1 = utrie_setRange32_63(sprepTrie,start,end + 1,(uint)uVar2,'\0');
    if (UVar1 == '\0') {
      fprintf(_stderr,"Value for certain codepoint already set.\n");
      exit(0xc);
    }
  }
  return;
}

Assistant:

extern void
storeRange(uint32_t start, uint32_t end, UStringPrepType type,UErrorCode* status){
    uint16_t trieWord = 0;

    if((int)(_SPREP_TYPE_THRESHOLD + type) > 0xFFFF){
        fprintf(stderr,"trieWord cannot contain value greater than 0xFFFF.\n");
        exit(U_ILLEGAL_CHAR_FOUND);
    }
    trieWord = (_SPREP_TYPE_THRESHOLD + type); /* the top 4 bits contain the value */
    if(start == end){
        uint32_t savedTrieWord = utrie_get32(sprepTrie, start, NULL);
        if(savedTrieWord>0){
            if(savedTrieWord < _SPREP_TYPE_THRESHOLD && type == USPREP_PROHIBITED){
                /* 
                 * A mapping is stored in the trie word 
                 * and the only other possible type that a 
                 * code point can have is USPREP_PROHIBITED
                 *
                 */

                /* turn on the 0th bit in the savedTrieWord */
                savedTrieWord += 0x01;

                /* the downcast is safe since we only save 16 bit values */
                trieWord = (uint16_t)savedTrieWord;

                /* make sure that the value of trieWord is less than the threshold */
                if(trieWord < _SPREP_TYPE_THRESHOLD){   
                    /* now set the value in the trie */
                    if(!utrie_set32(sprepTrie,start,trieWord)){
                        fprintf(stderr,"Could not set the value for code point.\n");
                        exit(U_ILLEGAL_ARGUMENT_ERROR);   
                    }
                    /* value is set so just return */
                    return;
                }else{
                    fprintf(stderr,"trieWord cannot contain value greater than threshold 0x%04X.\n",_SPREP_TYPE_THRESHOLD);
                    exit(U_ILLEGAL_CHAR_FOUND);
                }
 
            }else if(savedTrieWord != trieWord){
                fprintf(stderr,"Value for codepoint \\U%08X already set!.\n", (int)start);
                exit(U_ILLEGAL_ARGUMENT_ERROR);
            }
            /* if savedTrieWord == trieWord .. fall through and set the value */
        }
        if(!utrie_set32(sprepTrie,start,trieWord)){
            fprintf(stderr,"Could not set the value for code point \\U%08X.\n", (int)start);
            exit(U_ILLEGAL_ARGUMENT_ERROR);   
        }
    }else{
        if(!utrie_setRange32(sprepTrie, start, end+1, trieWord, FALSE)){
            fprintf(stderr,"Value for certain codepoint already set.\n");
            exit(U_ILLEGAL_CHAR_FOUND);   
        }
    }

}